

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O3

void __thiscall kj::MainBuilder::MainImpl::printHelp(MainImpl *this,StringPtr programName)

{
  StringPtr *pSVar1;
  size_t *psVar2;
  Arg *pAVar3;
  ObjectHeader *pOVar4;
  ProcessContext *pPVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  _Rb_tree_node_base *p_Var9;
  undefined1 *puVar10;
  Impl *pIVar11;
  char *pcVar12;
  _Base_ptr p_Var13;
  Impl *params_1;
  Impl *pIVar14;
  Arg *arg;
  Arg *this_00;
  char *pcVar15;
  ChunkHeader *pCVar16;
  size_t sVar17;
  undefined1 *puVar18;
  ChunkHeader *pCVar19;
  char *pcVar20;
  char *newSize;
  MainImpl *pMVar21;
  char **params_2;
  char **ppcVar22;
  char (*params_2_00) [62];
  ProcessContext *pPVar23;
  char *pcVar24;
  size_t sVar25;
  long lVar26;
  char *pcVar27;
  _Rb_tree_header *p_Var28;
  StringPtr indent;
  StringPtr indent_00;
  StringPtr indent_01;
  Vector<char> text;
  set<const_kj::MainBuilder::Impl::Option_*,_kj::MainBuilder::Impl::OptionDisplayOrder,_std::allocator<const_kj::MainBuilder::Impl::Option_*>_>
  sortedOptions;
  undefined1 local_e8 [32];
  undefined1 local_c8 [56];
  char *pcStack_90;
  Impl *local_88;
  _Rb_tree_node_base *local_80;
  _Base_ptr local_78;
  char local_70 [8];
  size_t local_68;
  _Rb_tree<kj::MainBuilder::Impl::Option_const*,kj::MainBuilder::Impl::Option_const*,std::_Identity<kj::MainBuilder::Impl::Option_const*>,kj::MainBuilder::Impl::OptionDisplayOrder,std::allocator<kj::MainBuilder::Impl::Option_const*>>
  local_60 [8];
  _Rb_tree_node_base local_58;
  size_t local_38;
  
  local_68 = programName.content.size_;
  local_70 = (char  [8])programName.content.ptr;
  pMVar21 = (MainImpl *)local_e8;
  params_2 = (char **)0x0;
  local_e8._0_8_ =
       kj::_::HeapArrayDisposer::allocateImpl
                 (1,0,0x400,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_e8._16_8_ =
       &(((Impl *)(local_e8._0_8_ + 0x360))->longOptions)._M_t._M_impl.super__Rb_tree_header.
        _M_header._M_left;
  local_e8._24_8_ = &kj::_::HeapArrayDisposer::instance;
  local_58._M_left = &local_58;
  local_58._M_color = _S_red;
  local_58._M_parent = (_Base_ptr)0x0;
  local_38 = 0;
  pIVar11 = (this->impl).ptr;
  p_Var9 = (pIVar11->shortOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var28 = &(pIVar11->shortOptions)._M_t._M_impl.super__Rb_tree_header;
  local_e8._8_8_ = local_e8._0_8_;
  local_c8._32_8_ = this;
  local_58._M_right = local_58._M_left;
  if ((_Rb_tree_header *)p_Var9 != p_Var28) {
    do {
      std::
      _Rb_tree<kj::MainBuilder::Impl::Option_const*,kj::MainBuilder::Impl::Option_const*,std::_Identity<kj::MainBuilder::Impl::Option_const*>,kj::MainBuilder::Impl::OptionDisplayOrder,std::allocator<kj::MainBuilder::Impl::Option_const*>>
      ::_M_insert_unique<kj::MainBuilder::Impl::Option_const*const&>
                (local_60,(Option **)&p_Var9[1]._M_parent);
      p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
    } while ((_Rb_tree_header *)p_Var9 != p_Var28);
    pIVar11 = *(Impl **)(local_c8._32_8_ + 8);
  }
  p_Var9 = (pIVar11->longOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var28 = &(pIVar11->longOptions)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var9 != p_Var28) {
    do {
      std::
      _Rb_tree<kj::MainBuilder::Impl::Option_const*,kj::MainBuilder::Impl::Option_const*,std::_Identity<kj::MainBuilder::Impl::Option_const*>,kj::MainBuilder::Impl::OptionDisplayOrder,std::allocator<kj::MainBuilder::Impl::Option_const*>>
      ::_M_insert_unique<kj::MainBuilder::Impl::Option_const*const&>
                (local_60,(Option **)&p_Var9[1]._M_left);
      p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
    } while ((_Rb_tree_header *)p_Var9 != p_Var28);
  }
  local_c8._40_8_ = " [<option>...]";
  if (local_38 == 0) {
    local_c8._40_8_ = "";
  }
  str<char_const(&)[8],kj::StringPtr&,char_const*>
            ((String *)local_c8,(kj *)"Usage: ",&local_70,(StringPtr *)(local_c8 + 0x28),params_2);
  pPVar23 = (ProcessContext *)
            ((char *)((long)&((ProcessContext *)(local_c8._0_8_ + -8))->_vptr_ProcessContext + 7) +
            local_c8._8_8_);
  pPVar5 = (ProcessContext *)local_c8._0_8_;
  if ((char **)local_c8._8_8_ == (char **)0x0) {
    pPVar23 = (ProcessContext *)0x0;
    pPVar5 = (ProcessContext *)0x0;
  }
  sVar25 = (long)pPVar23 - (long)pPVar5;
  puVar10 = (undefined1 *)(local_e8._8_8_ + (sVar25 - local_e8._0_8_));
  if ((undefined1 *)(local_e8._16_8_ - local_e8._0_8_) < puVar10) {
    puVar18 = (undefined1 *)0x4;
    if (local_e8._16_8_ != local_e8._0_8_) {
      puVar18 = (undefined1 *)((long)(local_e8._16_8_ - local_e8._0_8_) * 2);
    }
    if (puVar18 < puVar10) {
      puVar18 = puVar10;
    }
    Vector<char>::setCapacity((Vector<char> *)local_e8,(size_t)puVar18);
  }
  uVar6 = local_e8._8_8_;
  if (pPVar5 != pPVar23) {
    memcpy((void *)local_e8._8_8_,pPVar5,sVar25);
    local_e8._8_8_ = uVar6 + sVar25;
  }
  uVar7 = local_c8._32_8_;
  ppcVar22 = (char **)local_c8._8_8_;
  uVar6 = local_c8._0_8_;
  if ((ProcessContext *)local_c8._0_8_ != (ProcessContext *)0x0) {
    local_c8._0_8_ = (ProcessContext *)0x0;
    local_c8._8_8_ = (char **)0x0;
    (**(code **)((Array<char> *)local_c8._16_8_)->ptr)(local_c8._16_8_,uVar6,1,ppcVar22,ppcVar22,0);
    params_2 = ppcVar22;
  }
  pIVar11 = *(Impl **)(uVar7 + 8);
  if ((pIVar11->subCommands)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    pAVar3 = (pIVar11->args).builder.pos;
    for (this_00 = (pIVar11->args).builder.ptr; this_00 != pAVar3; this_00 = this_00 + 1) {
      if (local_e8._8_8_ == local_e8._16_8_) {
        sVar17 = (local_e8._8_8_ - local_e8._0_8_) * 2;
        if (local_e8._8_8_ == local_e8._0_8_) {
          sVar17 = 4;
        }
        Vector<char>::setCapacity((Vector<char> *)local_e8,sVar17);
      }
      *(undefined1 *)&((Array<char> *)local_e8._8_8_)->ptr = 0x20;
      local_e8._8_8_ = (long)&((Array<char> *)local_e8._8_8_)->ptr + 1;
      if (this_00->minCount == 0) {
        local_c8._40_8_ = "]";
        if (1 < this_00->maxCount) {
          local_c8._40_8_ = "...]";
        }
        str<char_const(&)[2],kj::StringPtr&,char_const*>
                  ((String *)local_c8,(kj *)"[",(char (*) [2])this_00,(StringPtr *)(local_c8 + 0x28)
                   ,params_2);
        pPVar23 = (ProcessContext *)
                  ((char *)((long)&((ProcessContext *)(local_c8._0_8_ + -8))->_vptr_ProcessContext +
                           7) + local_c8._8_8_);
        pPVar5 = (ProcessContext *)local_c8._0_8_;
        if ((char **)local_c8._8_8_ == (char **)0x0) {
          pPVar23 = (ProcessContext *)0x0;
          pPVar5 = (ProcessContext *)0x0;
        }
        sVar25 = (long)pPVar23 - (long)pPVar5;
        puVar10 = (undefined1 *)(local_e8._8_8_ + (sVar25 - local_e8._0_8_));
        if ((undefined1 *)(local_e8._16_8_ - local_e8._0_8_) < puVar10) {
          puVar18 = (undefined1 *)((long)(local_e8._16_8_ - local_e8._0_8_) * 2);
          if (local_e8._16_8_ == local_e8._0_8_) {
            puVar18 = (undefined1 *)0x4;
          }
          if (puVar18 < puVar10) {
            puVar18 = puVar10;
          }
          Vector<char>::setCapacity((Vector<char> *)local_e8,(size_t)puVar18);
        }
        uVar6 = local_e8._8_8_;
        if (pPVar5 != pPVar23) {
          memcpy((void *)local_e8._8_8_,pPVar5,sVar25);
          local_e8._8_8_ = uVar6 + sVar25;
        }
        ppcVar22 = (char **)local_c8._8_8_;
        uVar6 = local_c8._0_8_;
        if ((ProcessContext *)local_c8._0_8_ != (ProcessContext *)0x0) {
          local_c8._0_8_ = (ProcessContext *)0x0;
          local_c8._8_8_ = (char **)0x0;
          (**(code **)((Array<char> *)local_c8._16_8_)->ptr)
                    (local_c8._16_8_,uVar6,1,ppcVar22,ppcVar22,0);
          params_2 = ppcVar22;
        }
      }
      else {
        local_c8._40_8_ = "";
        if (1 < this_00->maxCount) {
          local_c8._40_8_ = "...";
        }
        str<kj::StringPtr&,char_const*>
                  ((String *)local_c8,(kj *)this_00,(StringPtr *)(local_c8 + 0x28),(char **)0x59c792
                  );
        pPVar23 = (ProcessContext *)
                  ((char *)((long)&((ProcessContext *)(local_c8._0_8_ + -8))->_vptr_ProcessContext +
                           7) + local_c8._8_8_);
        pPVar5 = (ProcessContext *)local_c8._0_8_;
        if ((char **)local_c8._8_8_ == (char **)0x0) {
          pPVar23 = (ProcessContext *)0x0;
          pPVar5 = (ProcessContext *)0x0;
        }
        sVar25 = (long)pPVar23 - (long)pPVar5;
        puVar10 = (undefined1 *)(local_e8._8_8_ + (sVar25 - local_e8._0_8_));
        if ((undefined1 *)(local_e8._16_8_ - local_e8._0_8_) < puVar10) {
          puVar18 = (undefined1 *)((long)(local_e8._16_8_ - local_e8._0_8_) * 2);
          if (local_e8._16_8_ == local_e8._0_8_) {
            puVar18 = (undefined1 *)0x4;
          }
          if (puVar18 < puVar10) {
            puVar18 = puVar10;
          }
          Vector<char>::setCapacity((Vector<char> *)local_e8,(size_t)puVar18);
        }
        uVar6 = local_e8._8_8_;
        if (pPVar5 != pPVar23) {
          memcpy((void *)local_e8._8_8_,pPVar5,sVar25);
          local_e8._8_8_ = uVar6 + sVar25;
        }
        ppcVar22 = (char **)local_c8._8_8_;
        uVar6 = local_c8._0_8_;
        if ((ProcessContext *)local_c8._0_8_ != (ProcessContext *)0x0) {
          local_c8._0_8_ = (ProcessContext *)0x0;
          local_c8._8_8_ = (char **)0x0;
          (**(code **)((Array<char> *)local_c8._16_8_)->ptr)(local_c8._16_8_,uVar6,1);
          params_2 = ppcVar22;
        }
      }
    }
  }
  else {
    local_c8._0_8_ = " <command> [<arg>...]";
    local_c8._8_8_ = (char *)0x16;
    Vector<char>::addAll<kj::StringPtr>((Vector<char> *)local_e8,(StringPtr *)local_c8);
  }
  local_c8._0_8_ = "\n\n";
  local_c8._8_8_ = (char *)0x3;
  Vector<char>::addAll<kj::StringPtr>((Vector<char> *)local_e8,(StringPtr *)local_c8);
  pCVar16 = (ChunkHeader *)local_c8._32_8_;
  pSVar1 = &(*(Impl **)(local_c8._32_8_ + 8))->briefDescription;
  params_2_00 = (char (*) [62])(pSVar1->content).ptr;
  indent.content.size_ = 1;
  indent.content.ptr = "";
  wrapText(pMVar21,(Vector<char> *)local_e8,indent,(StringPtr)pSVar1->content);
  if (((*(Impl **)((long)pCVar16 + 8))->subCommands)._M_t._M_impl.super__Rb_tree_header.
      _M_node_count != 0) goto LAB_004b4765;
  do {
    if (local_38 != 0) {
      local_c8._0_8_ = "\nOptions:\n";
      local_c8._8_8_ = (Impl *)0xb;
      Vector<char>::addAll<kj::StringPtr>((Vector<char> *)local_e8,(StringPtr *)local_c8);
      p_Var13 = local_58._M_left;
      while (p_Var13 != &local_58) {
        local_c8._24_8_ = *(undefined8 *)(p_Var13 + 1);
        puVar10 = (undefined1 *)(local_e8._8_8_ + (4 - local_e8._0_8_));
        pIVar11 = (Impl *)local_e8._16_8_;
        local_80 = p_Var13;
        if ((undefined1 *)(local_e8._16_8_ - local_e8._0_8_) < puVar10) {
          puVar18 = (undefined1 *)((long)(local_e8._16_8_ - local_e8._0_8_) * 2);
          if (local_e8._16_8_ == local_e8._0_8_) {
            puVar18 = (undefined1 *)0x4;
          }
          if (puVar18 < puVar10) {
            puVar18 = puVar10;
          }
          pIVar11 = (Impl *)local_e8;
          Vector<char>::setCapacity((Vector<char> *)local_e8,(size_t)puVar18);
        }
        *(undefined4 *)&((Array<char> *)&((Impl *)local_e8._8_8_)->context)->ptr = 0x20202020;
        local_e8._8_8_ = (long)&((Array<char> *)&((Impl *)local_e8._8_8_)->context)->ptr + 4;
        p_Var13 = (_Base_ptr)(((StringPtr *)(local_c8._24_8_ + 8))->content).ptr;
        if (p_Var13 != (_Base_ptr)0x0) {
          local_78 = (_Base_ptr)&(((StringPtr *)(local_c8._24_8_ + 0x18))->content).size_;
          pcVar15 = ((Array<char> *)local_c8._24_8_)->ptr + 8;
          lVar26 = (long)p_Var13 << 4;
          bVar8 = true;
          params_1 = (Impl *)local_c8._24_8_;
          do {
            if (!bVar8) {
              puVar10 = (undefined1 *)(local_e8._8_8_ + (2 - local_e8._0_8_));
              if ((undefined1 *)(local_e8._16_8_ - local_e8._0_8_) < puVar10) {
                puVar18 = (undefined1 *)((long)(local_e8._16_8_ - local_e8._0_8_) * 2);
                if (local_e8._16_8_ == local_e8._0_8_) {
                  puVar18 = (undefined1 *)0x4;
                }
                if (puVar18 < puVar10) {
                  puVar18 = puVar10;
                }
                Vector<char>::setCapacity((Vector<char> *)local_e8,(size_t)puVar18);
              }
              *(undefined2 *)&((Array<char> *)&((Impl *)local_e8._8_8_)->context)->ptr = 0x202c;
              params_1 = (Impl *)((long)&((Array<char> *)&((Impl *)local_e8._8_8_)->context)->ptr +
                                 2);
              local_e8._8_8_ = params_1;
            }
            if (pcVar15[-8] == '\x01') {
              pIVar11 = (Impl *)local_c8;
              str<char_const(&)[3],char_const*const&>
                        ((String *)pIVar11,(kj *)"--",(char (*) [3])pcVar15,(char **)params_1);
              pPVar23 = (ProcessContext *)
                        ((char *)((long)&((ProcessContext *)(local_c8._0_8_ + -8))->
                                         _vptr_ProcessContext + 7) + local_c8._8_8_);
              pPVar5 = (ProcessContext *)local_c8._0_8_;
              if ((Impl *)local_c8._8_8_ == (Impl *)0x0) {
                pPVar23 = (ProcessContext *)0x0;
                pPVar5 = (ProcessContext *)0x0;
              }
              sVar25 = (long)pPVar23 - (long)pPVar5;
              puVar10 = (undefined1 *)(local_e8._8_8_ + (sVar25 - local_e8._0_8_));
              params_1 = (Impl *)local_e8._0_8_;
              if ((undefined1 *)(local_e8._16_8_ - local_e8._0_8_) < puVar10) {
                puVar18 = (undefined1 *)((long)(local_e8._16_8_ - local_e8._0_8_) * 2);
                params_1 = (Impl *)&DAT_00000004;
                if (local_e8._16_8_ == local_e8._0_8_) {
                  puVar18 = (undefined1 *)0x4;
                }
                if (puVar18 < puVar10) {
                  puVar18 = puVar10;
                }
                pIVar11 = (Impl *)local_e8;
                Vector<char>::setCapacity((Vector<char> *)local_e8,(size_t)puVar18);
              }
              uVar6 = local_e8._8_8_;
              if (pPVar5 != pPVar23) {
                pIVar11 = (Impl *)local_e8._8_8_;
                memcpy((void *)local_e8._8_8_,pPVar5,sVar25);
                local_e8._8_8_ = uVar6 + sVar25;
              }
              pIVar14 = (Impl *)local_c8._8_8_;
              uVar6 = local_c8._0_8_;
              if ((ProcessContext *)local_c8._0_8_ != (ProcessContext *)0x0) {
                local_c8._0_8_ = (ProcessContext *)0x0;
                local_c8._8_8_ = (Impl *)0x0;
                pIVar11 = (Impl *)local_c8._16_8_;
                (**(code **)((Array<char> *)local_c8._16_8_)->ptr)
                          (local_c8._16_8_,uVar6,1,pIVar14,pIVar14);
                params_1 = pIVar14;
              }
              if (*(char *)&(((StringPtr *)(local_c8._24_8_ + 8))->content).size_ == '\x01') {
                pIVar11 = (Impl *)local_c8;
                str<char_const(&)[2],kj::StringPtr_const&>
                          ((String *)pIVar11,(kj *)0x5882d6,(char (*) [2])local_78,
                           (StringPtr *)params_1);
                pPVar23 = (ProcessContext *)
                          ((char *)((long)&((ProcessContext *)(local_c8._0_8_ + -8))->
                                           _vptr_ProcessContext + 7) + local_c8._8_8_);
                pPVar5 = (ProcessContext *)local_c8._0_8_;
                if ((Impl *)local_c8._8_8_ == (Impl *)0x0) {
                  pPVar23 = (ProcessContext *)0x0;
                  pPVar5 = (ProcessContext *)0x0;
                }
                sVar25 = (long)pPVar23 - (long)pPVar5;
                puVar10 = (undefined1 *)(local_e8._8_8_ + (sVar25 - local_e8._0_8_));
                params_1 = (Impl *)local_e8._0_8_;
                if ((undefined1 *)(local_e8._16_8_ - local_e8._0_8_) < puVar10) {
                  puVar18 = (undefined1 *)((long)(local_e8._16_8_ - local_e8._0_8_) * 2);
                  params_1 = (Impl *)&DAT_00000004;
                  if (local_e8._16_8_ == local_e8._0_8_) {
                    puVar18 = (undefined1 *)0x4;
                  }
                  if (puVar18 < puVar10) {
                    puVar18 = puVar10;
                  }
                  pIVar11 = (Impl *)local_e8;
                  Vector<char>::setCapacity((Vector<char> *)local_e8,(size_t)puVar18);
                }
                uVar6 = local_e8._8_8_;
                if (pPVar5 != pPVar23) {
                  pIVar11 = (Impl *)local_e8._8_8_;
                  memcpy((void *)local_e8._8_8_,pPVar5,sVar25);
                  local_e8._8_8_ = uVar6 + sVar25;
                }
                pIVar14 = (Impl *)local_c8._8_8_;
                uVar6 = local_c8._0_8_;
                if ((ProcessContext *)local_c8._0_8_ != (ProcessContext *)0x0) {
                  local_c8._0_8_ = (ProcessContext *)0x0;
                  local_c8._8_8_ = (Impl *)0x0;
                  pIVar11 = (Impl *)local_c8._16_8_;
                  (**(code **)((Array<char> *)local_c8._16_8_)->ptr)
                            (local_c8._16_8_,uVar6,1,pIVar14,pIVar14);
                  params_1 = pIVar14;
                }
              }
            }
            else {
              pIVar11 = (Impl *)local_c8;
              str<char_const(&)[2],char_const&>
                        ((String *)pIVar11,(kj *)0x52b2d8,(char (*) [2])pcVar15,(char *)params_1);
              pPVar23 = (ProcessContext *)
                        ((char *)((long)&((ProcessContext *)(local_c8._0_8_ + -8))->
                                         _vptr_ProcessContext + 7) + local_c8._8_8_);
              pPVar5 = (ProcessContext *)local_c8._0_8_;
              if ((Impl *)local_c8._8_8_ == (Impl *)0x0) {
                pPVar23 = (ProcessContext *)0x0;
                pPVar5 = (ProcessContext *)0x0;
              }
              sVar25 = (long)pPVar23 - (long)pPVar5;
              puVar10 = (undefined1 *)(local_e8._8_8_ + (sVar25 - local_e8._0_8_));
              params_1 = (Impl *)local_e8._0_8_;
              if ((undefined1 *)(local_e8._16_8_ - local_e8._0_8_) < puVar10) {
                puVar18 = (undefined1 *)((long)(local_e8._16_8_ - local_e8._0_8_) * 2);
                params_1 = (Impl *)&DAT_00000004;
                if (local_e8._16_8_ == local_e8._0_8_) {
                  puVar18 = (undefined1 *)0x4;
                }
                if (puVar18 < puVar10) {
                  puVar18 = puVar10;
                }
                pIVar11 = (Impl *)local_e8;
                Vector<char>::setCapacity((Vector<char> *)local_e8,(size_t)puVar18);
              }
              uVar6 = local_e8._8_8_;
              if (pPVar5 != pPVar23) {
                pIVar11 = (Impl *)local_e8._8_8_;
                memcpy((void *)local_e8._8_8_,pPVar5,sVar25);
                local_e8._8_8_ = uVar6 + sVar25;
              }
              pIVar14 = (Impl *)local_c8._8_8_;
              uVar6 = local_c8._0_8_;
              if ((ProcessContext *)local_c8._0_8_ != (ProcessContext *)0x0) {
                local_c8._0_8_ = (ProcessContext *)0x0;
                local_c8._8_8_ = (Impl *)0x0;
                pIVar11 = (Impl *)local_c8._16_8_;
                (**(code **)((Array<char> *)local_c8._16_8_)->ptr)
                          (local_c8._16_8_,uVar6,1,pIVar14,pIVar14,0);
                params_1 = pIVar14;
              }
              if (*(char *)&(((StringPtr *)(local_c8._24_8_ + 8))->content).size_ == '\x01') {
                pcVar27 = (char *)(((StringPtr *)(local_c8._24_8_ + 0x18))->content).size_;
                pcVar24 = (((StringPtr *)(local_c8._24_8_ + 0x28))->content).ptr;
                pcVar12 = (char *)((long)&((Array<char> *)local_e8._8_8_)->ptr +
                                  (long)(pcVar24 + (-1 - local_e8._0_8_)));
                params_1 = (Impl *)local_e8._0_8_;
                if ((char *)(local_e8._16_8_ - local_e8._0_8_) < pcVar12) {
                  pcVar20 = (char *)((long)(local_e8._16_8_ - local_e8._0_8_) * 2);
                  params_1 = (Impl *)&DAT_00000004;
                  if (local_e8._16_8_ == local_e8._0_8_) {
                    pcVar20 = (char *)0x4;
                  }
                  if (pcVar20 < pcVar12) {
                    pcVar20 = pcVar12;
                  }
                  pIVar11 = (Impl *)local_e8;
                  Vector<char>::setCapacity((Vector<char> *)local_e8,(size_t)pcVar20);
                }
                uVar6 = local_e8._8_8_;
                if (pcVar27 != pcVar27 + (long)(pcVar24 + -1)) {
                  memcpy((void *)local_e8._8_8_,pcVar27,(size_t)(pcVar24 + -1));
                  pIVar11 = (Impl *)local_e8._8_8_;
                  local_e8._8_8_ =
                       (Impl *)((long)&((Array<char> *)uVar6)->ptr + (long)(pcVar24 + -1));
                }
              }
            }
            pcVar15 = pcVar15 + 0x10;
            bVar8 = false;
            lVar26 = lVar26 + -0x10;
            pCVar16 = (ChunkHeader *)local_c8._32_8_;
          } while (lVar26 != 0);
        }
        if (local_e8._8_8_ == local_e8._16_8_) {
          sVar17 = (local_e8._8_8_ - local_e8._0_8_) * 2;
          if (local_e8._8_8_ == local_e8._0_8_) {
            sVar17 = 4;
          }
          pIVar11 = (Impl *)local_e8;
          Vector<char>::setCapacity((Vector<char> *)local_e8,sVar17);
        }
        *(undefined1 *)&((Array<char> *)local_e8._8_8_)->ptr = 10;
        local_e8._8_8_ = (long)&((Array<char> *)local_e8._8_8_)->ptr + 1;
        psVar2 = &(((StringPtr *)(local_c8._24_8_ + 0x28))->content).size_;
        params_2_00 = (char (*) [62])*psVar2;
        indent_01.content.size_ = 9;
        indent_01.content.ptr = "        ";
        wrapText((MainImpl *)pIVar11,(Vector<char> *)local_e8,indent_01,
                 (StringPtr)*(ArrayPtr<const_char> *)psVar2);
        p_Var13 = (_Base_ptr)std::_Rb_tree_increment(local_80);
      }
      local_c8._0_8_ = "    --help\n        Display this help text and exit.\n";
      local_c8._8_8_ = (char *)0x35;
      Vector<char>::addAll<kj::StringPtr>((Vector<char> *)local_e8,(StringPtr *)local_c8);
    }
    if ((((Impl *)pCVar16->pos)->extendedDescription).content.size_ != 1) {
      local_c8[0] = 10;
      pMVar21 = (MainImpl *)local_e8;
      Vector<char>::add<char>((Vector<char> *)local_e8,local_c8);
      pSVar1 = &((Impl *)pCVar16->pos)->extendedDescription;
      params_2_00 = (char (*) [62])(pSVar1->content).ptr;
      indent_00.content.size_ = 1;
      indent_00.content.ptr = "";
      wrapText(pMVar21,(Vector<char> *)local_e8,indent_00,(StringPtr)pSVar1->content);
    }
    local_c8._0_8_ = local_c8._0_8_ & 0xffffffffffffff00;
    Vector<char>::add<char>((Vector<char> *)local_e8,local_c8);
    pCVar16 = (ChunkHeader *)((Impl *)pCVar16->pos)->context;
    Vector<char>::releaseAsArray((Array<char> *)(local_c8 + 0x30),(Vector<char> *)local_e8);
    pcVar15 = pcStack_90;
    uVar6 = local_c8._48_8_;
    local_c8._0_8_ = local_c8._48_8_;
    local_c8._8_8_ = pcStack_90;
    local_c8._16_8_ = local_88;
    local_c8._48_8_ = (ChunkHeader *)0x0;
    pcStack_90 = (char *)0x0;
    pCVar19 = (ChunkHeader *)0x524569;
    if (pcVar15 != (char *)0x0) {
      pCVar19 = (ChunkHeader *)uVar6;
    }
    (*(code *)((Own<kj::MainBuilder::Impl,_std::nullptr_t> *)&pCVar16->next)->disposer[5].
              _vptr_Disposer)(pCVar16,pCVar19,pcVar15 + (pcVar15 == (char *)0x0));
LAB_004b4765:
    local_c8._0_8_ = "\nCommands:\n";
    local_c8._8_8_ = (char *)0xc;
    Vector<char>::addAll<kj::StringPtr>((Vector<char> *)local_e8,(StringPtr *)local_c8);
    pIVar11 = (Impl *)(((Impl *)pCVar16->pos)->subCommands)._M_t._M_impl.super__Rb_tree_header.
                      _M_header._M_left;
    p_Var28 = &(((Impl *)pCVar16->pos)->subCommands)._M_t._M_impl.super__Rb_tree_header;
    local_c8._24_8_ = pIVar11;
    if (pIVar11 != (Impl *)p_Var28) {
      pcVar15 = (char *)0x0;
      do {
        pcVar24 = pcVar15;
        pcVar27 = (pIVar11->extendedDescription).content.ptr + -1;
        pcVar15 = pcVar27;
        if (pcVar27 < pcVar24) {
          pcVar15 = pcVar24;
        }
        pIVar11 = (Impl *)std::_Rb_tree_increment((_Rb_tree_node_base *)pIVar11);
      } while (pIVar11 != (Impl *)p_Var28);
      if ((_Rb_tree_header *)local_c8._24_8_ != p_Var28) {
        pIVar11 = (Impl *)local_e8._8_8_;
        if (pcVar27 < pcVar24) {
          pcVar27 = pcVar24;
        }
        do {
          puVar10 = (undefined1 *)((long)pIVar11 + (2 - local_e8._0_8_));
          if ((undefined1 *)(local_e8._16_8_ - local_e8._0_8_) < puVar10) {
            puVar18 = (undefined1 *)((long)(local_e8._16_8_ - local_e8._0_8_) * 2);
            if (local_e8._16_8_ == local_e8._0_8_) {
              puVar18 = (undefined1 *)0x4;
            }
            if (puVar18 < puVar10) {
              puVar18 = puVar10;
            }
            Vector<char>::setCapacity((Vector<char> *)local_e8,(size_t)puVar18);
            pIVar11 = (Impl *)local_e8._8_8_;
          }
          *(undefined2 *)&((Array<char> *)&pIVar11->context)->ptr = 0x2020;
          local_e8._8_8_ = (long)&((Array<char> *)&pIVar11->context)->ptr + 2;
          pcVar24 = (char *)(((StringPtr *)(local_c8._24_8_ + 0x18))->content).size_;
          pcVar12 = (((StringPtr *)(local_c8._24_8_ + 0x28))->content).ptr;
          pcVar20 = (char *)((long)&((Array<char> *)&((Impl *)local_e8._8_8_)->context)->ptr +
                            (long)(pcVar12 + (-1 - local_e8._0_8_)));
          if ((char *)(local_e8._16_8_ - local_e8._0_8_) < pcVar20) {
            newSize = (char *)((long)(local_e8._16_8_ - local_e8._0_8_) * 2);
            if (local_e8._16_8_ == local_e8._0_8_) {
              newSize = (char *)0x4;
            }
            if (newSize < pcVar20) {
              newSize = pcVar20;
            }
            Vector<char>::setCapacity((Vector<char> *)local_e8,(size_t)newSize);
          }
          uVar6 = local_e8._8_8_;
          if (pcVar24 != pcVar12 + -1 + (long)pcVar24) {
            memcpy((void *)local_e8._8_8_,pcVar24,(size_t)(pcVar12 + -1));
            local_e8._8_8_ = (long)&((Array<char> *)uVar6)->ptr + (long)(pcVar12 + -1);
          }
          pcVar24 = (((StringPtr *)(local_c8._24_8_ + 0x28))->content).ptr;
          if (pcVar24 + -1 < pcVar15) {
            pcVar24 = (char *)((long)pcVar27 + (1 - (long)pcVar24));
            do {
              if (local_e8._8_8_ == local_e8._16_8_) {
                sVar17 = (local_e8._8_8_ - local_e8._0_8_) * 2;
                if (local_e8._8_8_ == local_e8._0_8_) {
                  sVar17 = 4;
                }
                Vector<char>::setCapacity((Vector<char> *)local_e8,sVar17);
              }
              *(undefined1 *)&((Array<char> *)local_e8._8_8_)->ptr = 0x20;
              local_e8._8_8_ = (long)&((Array<char> *)local_e8._8_8_)->ptr + 1;
              pcVar24 = pcVar24 + -1;
            } while (pcVar24 != (char *)0x0);
          }
          puVar10 = (undefined1 *)(local_e8._8_8_ + (2 - local_e8._0_8_));
          if ((undefined1 *)(local_e8._16_8_ - local_e8._0_8_) < puVar10) {
            puVar18 = (undefined1 *)((long)(local_e8._16_8_ - local_e8._0_8_) * 2);
            if (local_e8._16_8_ == local_e8._0_8_) {
              puVar18 = (undefined1 *)0x4;
            }
            if (puVar18 < puVar10) {
              puVar18 = puVar10;
            }
            Vector<char>::setCapacity((Vector<char> *)local_e8,(size_t)puVar18);
          }
          *(undefined2 *)&((Array<char> *)&((Impl *)local_e8._8_8_)->context)->ptr = 0x2020;
          local_e8._8_8_ = (long)&((Array<char> *)&((Impl *)local_e8._8_8_)->context)->ptr + 2;
          pCVar16 = ((Arena *)(local_c8._24_8_ + 0x38))->chunkList;
          pOVar4 = ((Arena *)(local_c8._24_8_ + 0x38))->objectList;
          puVar10 = (undefined1 *)((long)pOVar4 + (long)(local_e8._8_8_ + (-1 - local_e8._0_8_)));
          if ((undefined1 *)(local_e8._16_8_ - local_e8._0_8_) < puVar10) {
            puVar18 = (undefined1 *)((long)(local_e8._16_8_ - local_e8._0_8_) * 2);
            if (local_e8._16_8_ == local_e8._0_8_) {
              puVar18 = (undefined1 *)0x4;
            }
            if (puVar18 < puVar10) {
              puVar18 = puVar10;
            }
            Vector<char>::setCapacity((Vector<char> *)local_e8,(size_t)puVar18);
          }
          uVar6 = local_e8._8_8_;
          if (pCVar16 != (ChunkHeader *)((undefined1 *)((long)&pOVar4[-1].next + 7) + (long)pCVar16)
             ) {
            puVar10 = (undefined1 *)((long)&pOVar4[-1].next + 7);
            memcpy((void *)local_e8._8_8_,pCVar16,(size_t)puVar10);
            local_e8._8_8_ = (long)&((Array<char> *)uVar6)->ptr + (long)puVar10;
          }
          if (local_e8._8_8_ == local_e8._16_8_) {
            sVar17 = (local_e8._8_8_ - local_e8._0_8_) * 2;
            if (local_e8._8_8_ == local_e8._0_8_) {
              sVar17 = 4;
            }
            Vector<char>::setCapacity((Vector<char> *)local_e8,sVar17);
          }
          *(undefined1 *)&((Array<char> *)local_e8._8_8_)->ptr = 10;
          pIVar11 = (Impl *)((long)&((Array<char> *)local_e8._8_8_)->ptr + 1);
          local_e8._8_8_ = pIVar11;
          local_c8._24_8_ = std::_Rb_tree_increment((_Rb_tree_node_base *)local_c8._24_8_);
        } while ((_Rb_tree_header *)local_c8._24_8_ != p_Var28);
      }
    }
    str<char_const(&)[7],kj::StringPtr&,char_const(&)[62]>
              ((String *)local_c8,(kj *)"\nSee \'",(char (*) [7])local_70,
               (StringPtr *)" help <command>\' for more information on a specific command.\n",
               params_2_00);
    Vector<char>::addAll<kj::String>((Vector<char> *)local_e8,(String *)local_c8);
    String::~String((String *)local_c8);
    pCVar16 = (ChunkHeader *)local_c8._32_8_;
  } while( true );
}

Assistant:

void MainBuilder::MainImpl::printHelp(StringPtr programName) {
  Vector<char> text(1024);

  std::set<const Impl::Option*, Impl::OptionDisplayOrder> sortedOptions;

  for (auto& entry: impl->shortOptions) {
    sortedOptions.insert(entry.second);
  }
  for (auto& entry: impl->longOptions) {
    sortedOptions.insert(entry.second);
  }

  text.addAll(str("Usage: ", programName, sortedOptions.empty() ? "" : " [<option>...]"));

  if (impl->subCommands.empty()) {
    for (auto& arg: impl->args) {
      text.add(' ');
      if (arg.minCount == 0) {
        text.addAll(str("[", arg.title, arg.maxCount > 1 ? "...]" : "]"));
      } else {
        text.addAll(str(arg.title, arg.maxCount > 1 ? "..." : ""));
      }
    }
  } else {
    text.addAll(" <command> [<arg>...]"_kj);
  }
  text.addAll("\n\n"_kj);

  wrapText(text, "", impl->briefDescription);

  if (!impl->subCommands.empty()) {
    text.addAll("\nCommands:\n"_kj);
    size_t maxLen = 0;
    for (auto& command: impl->subCommands) {
      maxLen = kj::max(maxLen, command.first.size());
    }
    for (auto& command: impl->subCommands) {
      text.addAll("  "_kj);
      text.addAll(command.first);
      for (size_t i = command.first.size(); i < maxLen; i++) {
        text.add(' ');
      }
      text.addAll("  "_kj);
      text.addAll(command.second.helpText);
      text.add('\n');
    }
    text.addAll(str(
        "\nSee '", programName, " help <command>' for more information on a specific command.\n"));
  }

  if (!sortedOptions.empty()) {
    text.addAll("\nOptions:\n"_kj);

    for (auto opt: sortedOptions) {
      text.addAll("    "_kj);
      bool isFirst = true;
      for (auto& name: opt->names) {
        if (isFirst) {
          isFirst = false;
        } else {
          text.addAll(", "_kj);
        }
        if (name.isLong) {
          text.addAll(str("--", name.longName));
          if (opt->hasArg) {
            text.addAll(str("=", opt->argTitle));
          }
        } else {
          text.addAll(str("-", name.shortName));
          if (opt->hasArg) {
            text.addAll(opt->argTitle);
          }
        }
      }
      text.add('\n');
      wrapText(text, "        ", opt->helpText);
    }

    text.addAll("    --help\n        Display this help text and exit.\n"_kj);
  }

  if (impl->extendedDescription.size() > 0) {
    text.add('\n');
    wrapText(text, "", impl->extendedDescription);
  }

  text.add('\0');
  impl->context.exitInfo(String(text.releaseAsArray()));
  KJ_CLANG_KNOWS_THIS_IS_UNREACHABLE_BUT_GCC_DOESNT
}